

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_pgroup_destroy(Integer grp_id)

{
  bool bVar1;
  long in_RDI;
  int ok;
  int i;
  logical ret;
  Integer in_stack_00000178;
  char *in_stack_00000180;
  bool local_19;
  int local_14;
  ulong local_10;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  ARMCI_Group_free((ARMCI_Group *)0x1da448);
  local_14 = 0;
  bVar1 = true;
  do {
    if (((GA[local_14].actv != 0) && (GA[local_14].p_handle == (int)in_RDI)) &&
       (GA[local_14].actv != 0)) {
      bVar1 = false;
    }
    local_14 = local_14 + 1;
    local_19 = local_14 < _max_global_array && bVar1;
  } while (local_19);
  if (!bVar1) {
    pnga_error(in_stack_00000180,in_stack_00000178);
  }
  local_10 = (ulong)(PGRP_LIST[in_RDI].actv != 0);
  PGRP_LIST[in_RDI].actv = 0;
  free(PGRP_LIST[in_RDI].map_proc_list);
  return local_10;
}

Assistant:

logical pnga_pgroup_destroy(Integer grp_id)
{
  logical ret = TRUE;
  int i, ok;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/

#ifdef MSG_COMMS_MPI
       ARMCI_Group_free(&PGRP_LIST[grp_id].group);
#endif
  /* check to make sure there are no GAs that depend on this process group */
  i=0;
  ok = 1;
  do{
      if (GA[i].actv) {
        if(GA[i].p_handle == (int)grp_id && GA[i].actv) ok = 0;
      }
      i++;
  }while(i<_max_global_array && ok);
  if (!ok) pnga_error("Attempt to destroy process group with attached GAs",grp_id);
  
  if (PGRP_LIST[grp_id].actv == 0) {
    ret = FALSE;
  }
  PGRP_LIST[grp_id].actv = 0;

  /* Deallocate memory for lists */
  free(PGRP_LIST[grp_id].map_proc_list);
  return ret;
}